

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall duckdb::ART::TransformToDeprecated(ART *this)

{
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_00;
  BlockManager *block_manager;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  type paVar2;
  FixedSizeAllocator *pFVar3;
  default_delete<duckdb::FixedSizeAllocator> *this_01;
  pointer __p;
  bool bVar4;
  unsafe_unique_ptr<FixedSizeAllocator> deprecated_allocator;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> local_30;
  FixedSizeAllocator *local_28;
  
  this_00 = &this->allocators;
  paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(this_00);
  block_manager =
       *(BlockManager **)
        paVar2->_M_elems[0].
        super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
        .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>;
  local_30._M_head_impl = (FixedSizeAllocator *)0x0;
  if (this->prefix_count != '\x0f') {
    pFVar3 = (FixedSizeAllocator *)operator_new(0xe8);
    FixedSizeAllocator::FixedSizeAllocator(pFVar3,0x18,block_manager);
    _Var1._M_head_impl = local_30._M_head_impl;
    local_28 = (FixedSizeAllocator *)0x0;
    bVar4 = local_30._M_head_impl != (FixedSizeAllocator *)0x0;
    local_30._M_head_impl = pFVar3;
    if (bVar4) {
      ::std::default_delete<duckdb::FixedSizeAllocator>::operator()
                ((default_delete<duckdb::FixedSizeAllocator> *)&local_30,_Var1._M_head_impl);
    }
    if (local_28 != (FixedSizeAllocator *)0x0) {
      ::std::default_delete<duckdb::FixedSizeAllocator>::operator()
                ((default_delete<duckdb::FixedSizeAllocator> *)&local_28,local_28);
    }
  }
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) != '\0') {
    Node::TransformToDeprecated(this,&this->tree,(unsafe_unique_ptr<FixedSizeAllocator> *)&local_30)
    ;
  }
  if (local_30._M_head_impl != (FixedSizeAllocator *)0x0) {
    this->prefix_count = '\x0f';
    paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(this_00);
    FixedSizeAllocator::Reset
              ((FixedSizeAllocator *)
               paVar2->_M_elems[0].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
    this_01 = (default_delete<duckdb::FixedSizeAllocator> *)
              shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
              ::operator*(this_00);
    _Var1._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (FixedSizeAllocator *)0x0;
    pFVar3 = *(FixedSizeAllocator **)this_01;
    *(FixedSizeAllocator **)this_01 = _Var1._M_head_impl;
    if (pFVar3 != (FixedSizeAllocator *)0x0) {
      ::std::default_delete<duckdb::FixedSizeAllocator>::operator()(this_01,pFVar3);
    }
  }
  if (local_30._M_head_impl != (FixedSizeAllocator *)0x0) {
    ::std::default_delete<duckdb::FixedSizeAllocator>::operator()
              ((default_delete<duckdb::FixedSizeAllocator> *)&local_30,local_30._M_head_impl);
  }
  return;
}

Assistant:

void ART::TransformToDeprecated() {
	auto idx = Node::GetAllocatorIdx(NType::PREFIX);
	auto &block_manager = (*allocators)[idx]->block_manager;
	unsafe_unique_ptr<FixedSizeAllocator> deprecated_allocator;

	if (prefix_count != Prefix::DEPRECATED_COUNT) {
		auto prefix_size = NumericCast<idx_t>(Prefix::DEPRECATED_COUNT) + NumericCast<idx_t>(Prefix::METADATA_SIZE);
		deprecated_allocator = make_unsafe_uniq<FixedSizeAllocator>(prefix_size, block_manager);
	}

	// Transform all leaves, and possibly the prefixes.
	if (tree.HasMetadata()) {
		Node::TransformToDeprecated(*this, tree, deprecated_allocator);
	}

	// Replace the prefix allocator with the deprecated allocator.
	if (deprecated_allocator) {
		prefix_count = Prefix::DEPRECATED_COUNT;

		D_ASSERT((*allocators)[idx]->Empty());
		(*allocators)[idx]->Reset();
		(*allocators)[idx] = std::move(deprecated_allocator);
	}
}